

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

ostream * soplex::operator<<(ostream *os,SVectorBase<double> *v)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  
  if (0 < v->memused) {
    bVar2 = true;
    lVar3 = 0;
    uVar4 = 1;
    do {
      dVar5 = *(double *)((long)&v->m_elem->val + lVar3);
      if (!bVar2) {
        if (0.0 <= dVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(os," + ",3);
          dVar5 = *(double *)((long)&v->m_elem->val + lVar3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(os," - ",3);
          dVar5 = -*(double *)((long)&v->m_elem->val + lVar3);
        }
      }
      std::ostream::_M_insert<double>(dVar5);
      std::__ostream_insert<char,std::char_traits<char>>(os," x",2);
      std::ostream::operator<<((ostream *)os,*(int *)((long)&v->m_elem->idx + lVar3));
      if ((uVar4 & 3) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n\t",2);
      }
      lVar3 = lVar3 + 0x10;
      bVar2 = false;
      bVar1 = (long)uVar4 < (long)v->memused;
      uVar4 = uVar4 + 1;
    } while (bVar1);
  }
  return os;
}

Assistant:

inline
std::ostream& operator<<(std::ostream& os, const SVectorBase<R>& v)
{
   for(int i = 0, j = 0; i < v.size(); ++i)
   {
      if(j)
      {
         if(v.value(i) < 0)
            os << " - " << -v.value(i);
         else
            os << " + " << v.value(i);
      }
      else
         os << v.value(i);

      os << " x" << v.index(i);
      j = 1;

      if((i + 1) % 4 == 0)
         os << "\n\t";
   }

   return os;
}